

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::CommandLineInterface::GenerateOutput
          (CommandLineInterface *this,
          vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
          *parsed_files,OutputDirective *output_directive,GeneratorContext *generator_context)

{
  bool bVar1;
  uint uVar2;
  LogMessage *pLVar3;
  ulong uVar4;
  ostream *poVar5;
  string local_158 [8];
  string parameters_1;
  undefined1 local_130 [8];
  string parameters;
  string plugin_name;
  LogMessage local_e8;
  byte local_ab;
  byte local_aa;
  allocator<char> local_a9;
  string local_a8;
  allocator<char> local_71;
  string local_70;
  undefined1 local_50 [8];
  string error;
  GeneratorContext *generator_context_local;
  OutputDirective *output_directive_local;
  vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  *parsed_files_local;
  CommandLineInterface *this_local;
  
  error.field_2._8_8_ = generator_context;
  std::__cxx11::string::string((string *)local_50);
  if (output_directive->generator != (CodeGenerator *)0x0) {
    std::__cxx11::string::string(local_158,(string *)&output_directive->parameter);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator[](&this->generator_parameters_,&output_directive->name);
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) == 0) {
      uVar4 = std::__cxx11::string::empty();
      if ((uVar4 & 1) == 0) {
        std::__cxx11::string::append((char *)local_158);
      }
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator[](&this->generator_parameters_,&output_directive->name);
      std::__cxx11::string::append(local_158);
    }
    uVar2 = (*output_directive->generator->_vptr_CodeGenerator[3])
                      (output_directive->generator,parsed_files,local_158,error.field_2._8_8_,
                       local_50);
    parameters_1.field_2._M_local_buf[0xc] = (uVar2 & 1) == 0;
    if ((bool)parameters_1.field_2._M_local_buf[0xc]) {
      poVar5 = std::operator<<((ostream *)&std::cerr,(string *)output_directive);
      poVar5 = std::operator<<(poVar5,": ");
      poVar5 = std::operator<<(poVar5,(string *)local_50);
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      this_local._7_1_ = 0;
    }
    parameters_1.field_2._13_3_ = 0;
    std::__cxx11::string::~string(local_158);
    goto joined_r0x0035c1b0;
  }
  std::allocator<char>::allocator();
  local_aa = 0;
  local_ab = 0;
  plugin_name.field_2._M_local_buf[0xf] = '\0';
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"--",&local_71);
  bVar1 = HasPrefixString(&output_directive->name,&local_70);
  if (bVar1) {
    std::allocator<char>::allocator();
    local_aa = 1;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,"_out",&local_a9);
    local_ab = 1;
    bVar1 = HasSuffixString(&output_directive->name,&local_a8);
    if (!bVar1) goto LAB_0035bc8f;
  }
  else {
LAB_0035bc8f:
    internal::LogMessage::LogMessage
              (&local_e8,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/compiler/command_line_interface.cc"
               ,0x5ff);
    plugin_name.field_2._M_local_buf[0xf] = '\x01';
    pLVar3 = internal::LogMessage::operator<<
                       (&local_e8,
                        "CHECK failed: HasPrefixString(output_directive.name, \"--\") && HasSuffixString(output_directive.name, \"_out\"): "
                       );
    pLVar3 = internal::LogMessage::operator<<(pLVar3,"Bad name for plugin generator: ");
    pLVar3 = internal::LogMessage::operator<<(pLVar3,&output_directive->name);
    internal::LogFinisher::operator=((LogFinisher *)(plugin_name.field_2._M_local_buf + 0xe),pLVar3)
    ;
  }
  if ((plugin_name.field_2._M_local_buf[0xf] & 1U) != 0) {
    internal::LogMessage::~LogMessage(&local_e8);
  }
  if ((local_ab & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_a8);
  }
  if ((local_aa & 1) != 0) {
    std::allocator<char>::~allocator(&local_a9);
  }
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_71);
  anon_unknown_0::PluginName
            ((string *)((long)&parameters.field_2 + 8),&this->plugin_prefix_,&output_directive->name
            );
  std::__cxx11::string::string((string *)local_130,(string *)&output_directive->parameter);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::operator[](&this->plugin_parameters_,(key_type *)((long)&parameters.field_2 + 8));
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) == 0) {
      std::__cxx11::string::append(local_130);
    }
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator[](&this->plugin_parameters_,(key_type *)((long)&parameters.field_2 + 8));
    std::__cxx11::string::append((string *)local_130);
  }
  bVar1 = GeneratePluginOutput
                    (this,parsed_files,(string *)((long)&parameters.field_2 + 8),(string *)local_130
                     ,(GeneratorContext *)error.field_2._8_8_,(string *)local_50);
  if (!bVar1) {
    poVar5 = std::operator<<((ostream *)&std::cerr,(string *)output_directive);
    poVar5 = std::operator<<(poVar5,": ");
    poVar5 = std::operator<<(poVar5,(string *)local_50);
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    this_local._7_1_ = 0;
  }
  parameters_1.field_2._13_3_ = 0;
  parameters_1.field_2._M_local_buf[0xc] = !bVar1;
  std::__cxx11::string::~string((string *)local_130);
  std::__cxx11::string::~string((string *)(parameters.field_2._M_local_buf + 8));
joined_r0x0035c1b0:
  if (parameters_1.field_2._12_4_ == 0) {
    this_local._7_1_ = 1;
    parameters_1.field_2._12_4_ = 1;
  }
  std::__cxx11::string::~string((string *)local_50);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool CommandLineInterface::GenerateOutput(
    const std::vector<const FileDescriptor*>& parsed_files,
    const OutputDirective& output_directive,
    GeneratorContext* generator_context) {
  // Call the generator.
  string error;
  if (output_directive.generator == NULL) {
    // This is a plugin.
    GOOGLE_CHECK(HasPrefixString(output_directive.name, "--") &&
          HasSuffixString(output_directive.name, "_out"))
        << "Bad name for plugin generator: " << output_directive.name;

    string plugin_name = PluginName(plugin_prefix_ , output_directive.name);
    string parameters = output_directive.parameter;
    if (!plugin_parameters_[plugin_name].empty()) {
      if (!parameters.empty()) {
        parameters.append(",");
      }
      parameters.append(plugin_parameters_[plugin_name]);
    }
    if (!GeneratePluginOutput(parsed_files, plugin_name,
                              parameters,
                              generator_context, &error)) {
      std::cerr << output_directive.name << ": " << error << std::endl;
      return false;
    }
  } else {
    // Regular generator.
    string parameters = output_directive.parameter;
    if (!generator_parameters_[output_directive.name].empty()) {
      if (!parameters.empty()) {
        parameters.append(",");
      }
      parameters.append(generator_parameters_[output_directive.name]);
    }
    if (!output_directive.generator->GenerateAll(
        parsed_files, parameters, generator_context, &error)) {
      // Generator returned an error.
      std::cerr << output_directive.name << ": " << error << std::endl;
      return false;
    }
  }

  return true;
}